

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

bool __thiscall QGraphicsView::viewportEvent(QGraphicsView *this,QEvent *event)

{
  QPointer<QGraphicsScene> *this_00;
  ushort uVar1;
  QGraphicsViewPrivate *d;
  QGraphicsScenePrivate *pQVar2;
  Type TVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QWidget *pQVar8;
  QWidget *pQVar9;
  Data *pDVar10;
  QMetaObject *pQVar11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  QPointF QVar13;
  QObject local_70 [8];
  QPointF local_68;
  undefined1 local_58 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  d = *(QGraphicsViewPrivate **)(this + 8);
  this_00 = &d->scene;
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (!bVar4) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar4 = QAbstractScrollArea::viewportEvent((QAbstractScrollArea *)this,event);
      return bVar4;
    }
    goto LAB_005bf1d5;
  }
  uVar1 = *(ushort *)(event + 8);
  switch(uVar1) {
  case 10:
  case 0x18:
    pDVar10 = (this_00->wp).d;
    if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
      pQVar12 = (QObject *)0x0;
    }
    else {
      pQVar12 = (d->scene).wp.value;
    }
    goto LAB_005bf13b;
  case 0xb:
    pQVar8 = QApplication::activePopupWidget();
    if (pQVar8 == (QWidget *)0x0) {
LAB_005bedc3:
      pQVar8 = QApplication::activeModalWidget();
      if (pQVar8 != (QWidget *)0x0) {
        pQVar8 = QApplication::activeModalWidget();
        pQVar9 = QWidget::window((QWidget *)this);
        if (pQVar8 != pQVar9) goto LAB_005bedf7;
      }
      pQVar8 = QApplication::activeWindow();
      pQVar9 = QWidget::window((QWidget *)this);
      if (pQVar8 != pQVar9) goto LAB_005bedf7;
    }
    else {
      pQVar8 = QApplication::activePopupWidget();
      pQVar9 = QWidget::window((QWidget *)this);
      if (pQVar8 == pQVar9) goto LAB_005bedc3;
LAB_005bedf7:
      pQVar2 = *(QGraphicsScenePrivate **)((d->scene).wp.value + 8);
      if ((pQVar2->popupWidgets).d.size != 0) {
        QGraphicsScenePrivate::removePopup(pQVar2,*(pQVar2->popupWidgets).d.ptr,false);
      }
    }
    d->field_0x300 = d->field_0x300 & 0xf7;
    local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneEvent::QGraphicsSceneEvent((QGraphicsSceneEvent *)local_58,GraphicsSceneLeave);
    pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,pQVar8);
    pDVar10 = (d->scene).wp.d;
    if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
      pQVar12 = (QObject *)0x0;
    }
    else {
      pQVar12 = (d->scene).wp.value;
    }
    QCoreApplication::sendEvent(pQVar12,(QEvent *)local_58);
    (**(code **)(*(long *)event + 0x10))(event,local_58[0xc]);
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
    break;
  case 0xc:
    d->field_0x301 = d->field_0x301 & 0xef;
    (d->dirtyScrollOffset).xp = 0;
    (d->dirtyScrollOffset).yp = 0;
    bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if ((bVar4) && (d->updateSceneSlotReimplementedChecked == false)) {
      d->updateSceneSlotReimplementedChecked = true;
      pQVar11 = (QMetaObject *)(*(code *)**(undefined8 **)this)(this);
      if (pQVar11 != &staticMetaObject) {
        iVar6 = QMetaObject::indexOfSlot((char *)pQVar11);
        iVar7 = QMetaObject::indexOfSlot((char *)&staticMetaObject);
        if (iVar6 != iVar7) {
          pDVar10 = (this_00->wp).d;
          if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
            pQVar12 = (QObject *)0x0;
          }
          else {
            pQVar12 = (d->scene).wp.value;
          }
          QObject::connect(local_70,(char *)pQVar12,(QObject *)"2changed(QList<QRectF>)",
                           (char *)this,0x679650);
          QMetaObject::Connection::~Connection((Connection *)local_70);
        }
      }
    }
    break;
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    break;
  case 0x11:
    bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if ((bVar4) && (bVar4 = QWidget::isActiveWindow((QWidget *)this), bVar4)) {
      TVar3 = WindowActivate;
LAB_005bf004:
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)local_58,TVar3);
      pDVar10 = (this_00->wp).d;
      if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
        pQVar12 = (QObject *)0x0;
      }
      else {
        pQVar12 = (d->scene).wp.value;
      }
      QCoreApplication::sendEvent(pQVar12,(QEvent *)local_58);
      QEvent::~QEvent((QEvent *)local_58);
    }
    break;
  case 0x12:
    if (((event[0xb] == (QEvent)0x0) &&
        (bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00), bVar4)) &&
       (bVar4 = QWidget::isActiveWindow((QWidget *)this), bVar4)) {
      TVar3 = WindowDeactivate;
      goto LAB_005bf004;
    }
    break;
  case 0x19:
    pDVar10 = (d->scene).wp.d;
    pQVar2 = *(QGraphicsScenePrivate **)((d->scene).wp.value + 8);
    if ((pQVar2->popupWidgets).d.size != 0) {
      pQVar12 = (QObject *)0x0;
      QGraphicsScenePrivate::removePopup(pQVar2,*(pQVar2->popupWidgets).d.ptr,false);
      pDVar10 = (this_00->wp).d;
      if (pDVar10 == (Data *)0x0) goto LAB_005bf13b;
    }
    if (*(int *)(pDVar10 + 4) == 0) {
      pQVar12 = (QObject *)0x0;
    }
    else {
      pQVar12 = (d->scene).wp.value;
    }
LAB_005bf13b:
    QCoreApplication::sendEvent(pQVar12,event);
    break;
  default:
    if (uVar1 - 0xc2 < 3) {
      if ((*(byte *)(*(long *)(this + 0x20) + 8) & 1) == 0) {
        bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
        if ((bVar4) && ((d->field_0x300 & 1) != 0)) {
          pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          *(QWidget **)(event + 0x40) = pQVar8;
          QGraphicsViewPrivate::translateTouchEvent(d,(QTouchEvent *)event);
          pDVar10 = (d->scene).wp.d;
          if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
            pQVar12 = (QObject *)0x0;
          }
          else {
            pQVar12 = (d->scene).wp.value;
          }
          QCoreApplication::sendEvent(pQVar12,event);
        }
        else {
          event[0xc] = (QEvent)0x0;
        }
        goto LAB_005bf175;
      }
LAB_005bed96:
      bVar4 = false;
    }
    else if (uVar1 == 0x6e) {
      local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneHelpEvent::QGraphicsSceneHelpEvent
                ((QGraphicsSceneHelpEvent *)local_58,GraphicsSceneHelp);
      pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,pQVar8);
      QGraphicsSceneHelpEvent::setScreenPos
                ((QGraphicsSceneHelpEvent *)local_58,(QPoint *)(event + 0x18));
      QVar13 = mapToScene(this,(QPoint *)(event + 0x10));
      local_68.yp = QVar13.yp;
      local_68.xp = QVar13.xp;
      QGraphicsSceneHelpEvent::setScenePos((QGraphicsSceneHelpEvent *)local_58,&local_68);
      pDVar10 = (this_00->wp).d;
      if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
        pQVar12 = (QObject *)0x0;
      }
      else {
        pQVar12 = (d->scene).wp.value;
      }
      QCoreApplication::sendEvent(pQVar12,(QEvent *)local_58);
      (**(code **)(*(long *)event + 0x10))(event,local_58[0xc]);
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
LAB_005bf175:
      bVar4 = true;
    }
    else {
      if ((uVar1 != 0xc6) && (uVar1 != 0xca)) break;
      if ((*(byte *)(*(long *)(this + 0x20) + 8) & 1) != 0) goto LAB_005bed96;
      bVar5 = QPointer::operator_cast_to_bool((QPointer *)this_00);
      bVar4 = true;
      if ((bVar5) && ((d->field_0x300 & 1) != 0)) {
        pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
        QGestureEvent::setWidget((QGestureEvent *)event,pQVar8);
        pDVar10 = (this_00->wp).d;
        if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
          pQVar12 = (QObject *)0x0;
        }
        else {
          pQVar12 = (d->scene).wp.value;
        }
        QCoreApplication::sendEvent(pQVar12,event);
      }
    }
    goto LAB_005bf178;
  }
  bVar4 = QAbstractScrollArea::viewportEvent((QAbstractScrollArea *)this,event);
LAB_005bf178:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
LAB_005bf1d5:
  __stack_chk_fail();
}

Assistant:

bool QGraphicsView::viewportEvent(QEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene)
        return QAbstractScrollArea::viewportEvent(event);

    switch (event->type()) {
    case QEvent::Enter:
        QCoreApplication::sendEvent(d->scene, event);
        break;
    case QEvent::WindowActivate:
        QCoreApplication::sendEvent(d->scene, event);
        break;
    case QEvent::WindowDeactivate:
        // ### This is a temporary fix for until we get proper mouse
        // grab events. mouseGrabberItem should be set to 0 if we lose
        // the mouse grab.
        // Remove all popups when the scene loses focus.
        if (!d->scene->d_func()->popupWidgets.isEmpty())
            d->scene->d_func()->removePopup(d->scene->d_func()->popupWidgets.constFirst());
        QCoreApplication::sendEvent(d->scene, event);
        break;
    case QEvent::Show:
        if (d->scene && isActiveWindow()) {
            QEvent windowActivate(QEvent::WindowActivate);
            QCoreApplication::sendEvent(d->scene, &windowActivate);
        }
        break;
    case QEvent::Hide:
        // spontaneous event will generate a WindowDeactivate.
        if (!event->spontaneous() && d->scene && isActiveWindow()) {
            QEvent windowDeactivate(QEvent::WindowDeactivate);
            QCoreApplication::sendEvent(d->scene, &windowDeactivate);
        }
        break;
    case QEvent::Leave: {
        // ### This is a temporary fix for until we get proper mouse grab
        // events. activeMouseGrabberItem should be set to 0 if we lose the
        // mouse grab.
        if ((QApplication::activePopupWidget() && QApplication::activePopupWidget() != window())
            || (QApplication::activeModalWidget() && QApplication::activeModalWidget() != window())
            || (QApplication::activeWindow() != window())) {
            if (!d->scene->d_func()->popupWidgets.isEmpty())
                d->scene->d_func()->removePopup(d->scene->d_func()->popupWidgets.constFirst());
        }
        d->useLastMouseEvent = false;
        QGraphicsSceneEvent leaveEvent(QEvent::GraphicsSceneLeave);
        leaveEvent.setWidget(viewport());
        QCoreApplication::sendEvent(d->scene, &leaveEvent);
        event->setAccepted(leaveEvent.isAccepted());
        break;
    }
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip: {
        QHelpEvent *toolTip = static_cast<QHelpEvent *>(event);
        QGraphicsSceneHelpEvent helpEvent(QEvent::GraphicsSceneHelp);
        helpEvent.setWidget(viewport());
        helpEvent.setScreenPos(toolTip->globalPos());
        helpEvent.setScenePos(mapToScene(toolTip->pos()));
        QCoreApplication::sendEvent(d->scene, &helpEvent);
        toolTip->setAccepted(helpEvent.isAccepted());
        return true;
    }
#endif
    case QEvent::Paint:
        // Reset full update
        d->fullUpdatePending = false;
        d->dirtyScrollOffset = QPoint();
        if (d->scene) {
            // Check if this view reimplements the updateScene slot; if it
            // does, we can't do direct update delivery and have to fall back
            // to connecting the changed signal.
            if (!d->updateSceneSlotReimplementedChecked) {
                d->updateSceneSlotReimplementedChecked = true;
                const QMetaObject *mo = metaObject();
                if (mo != &QGraphicsView::staticMetaObject) {
                    if (mo->indexOfSlot("updateScene(QList<QRectF>)")
                        != QGraphicsView::staticMetaObject.indexOfSlot("updateScene(QList<QRectF>)")) {
                        connect(d->scene, SIGNAL(changed(QList<QRectF>)),
                                this, SLOT(updateScene(QList<QRectF>)));
                    }
                }
            }
        }
        break;
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
    {
        if (!isEnabled())
            return false;

        if (d->scene && d->sceneInteractionAllowed) {
            // Convert and deliver the touch event to the scene.
            QTouchEvent *touchEvent = static_cast<QTouchEvent *>(event);
            QMutableTouchEvent::setTarget(touchEvent, viewport());
            QGraphicsViewPrivate::translateTouchEvent(d, touchEvent);
            QCoreApplication::sendEvent(d->scene, touchEvent);
        } else {
            event->ignore();
        }

        return true;
    }
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
    case QEvent::GestureOverride:
    {
        if (!isEnabled())
            return false;

        if (d->scene && d->sceneInteractionAllowed) {
            QGestureEvent *gestureEvent = static_cast<QGestureEvent *>(event);
            gestureEvent->setWidget(viewport());
            QCoreApplication::sendEvent(d->scene, gestureEvent);
        }
        return true;
    }
#endif // QT_NO_GESTURES
    default:
        break;
    }

    return QAbstractScrollArea::viewportEvent(event);
}